

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

N_Vector N_VMake_Serial(sunindextype length,realtype *v_data)

{
  void *pvVar1;
  N_Vector p_Var2;
  
  p_Var2 = N_VNewEmpty_Serial(length);
  if (p_Var2 == (N_Vector)0x0) {
    p_Var2 = (N_Vector)0x0;
  }
  else if (0 < length) {
    pvVar1 = p_Var2->content;
    *(undefined4 *)((long)pvVar1 + 8) = 0;
    *(realtype **)((long)pvVar1 + 0x10) = v_data;
  }
  return p_Var2;
}

Assistant:

N_Vector N_VMake_Serial(sunindextype length, realtype *v_data)
{
  N_Vector v;

  v = NULL;
  v = N_VNewEmpty_Serial(length);
  if (v == NULL) return(NULL);

  if (length > 0) {
    /* Attach data */
    NV_OWN_DATA_S(v) = SUNFALSE;
    NV_DATA_S(v)     = v_data;
  }

  return(v);
}